

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall cmTarget::cmTarget(cmTarget *this)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Snapshot snapshot;
  cmTargetInternals *__s;
  cmCommandContext local_70;
  Snapshot local_48;
  
  p_Var1 = &(this->Properties).
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->Utilities)._M_t._M_impl.super__Rb_tree_header;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->UtilityBacktraces)._M_t._M_impl.super__Rb_tree_header;
  (this->UtilityBacktraces)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->UtilityBacktraces)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->UtilityBacktraces)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->UtilityBacktraces)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->PolicyMap).Status.super__Base_bitset<4UL>._M_w[3] = 0;
  (this->PolicyMap).Status.super__Base_bitset<4UL>._M_w[1] = 0;
  (this->PolicyMap).Status.super__Base_bitset<4UL>._M_w[2] = 0;
  (this->UtilityBacktraces)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->PolicyMap).Status.super__Base_bitset<4UL>._M_w[0] = 0;
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  (this->InstallPath)._M_dataplus._M_p = (pointer)&(this->InstallPath).field_2;
  (this->InstallPath)._M_string_length = 0;
  (this->InstallPath).field_2._M_local_buf[0] = '\0';
  (this->RuntimeInstallPath)._M_dataplus._M_p = (pointer)&(this->RuntimeInstallPath).field_2;
  (this->RuntimeInstallPath)._M_string_length = 0;
  (this->RuntimeInstallPath).field_2._M_local_buf[0] = '\0';
  memset(&this->LinkDirectories,0,0xa8);
  __s = (cmTargetInternals *)operator_new(0x120);
  memset(__s,0,0x120);
  (this->Internal).Pointer = __s;
  cmState::Snapshot::Snapshot(&local_48,(cmState *)0x0);
  paVar2 = &local_70.Name.field_2;
  local_70.Name._M_string_length = 0;
  local_70.Name.field_2._M_local_buf[0] = '\0';
  local_70.Line = 0;
  snapshot.Position.Tree = local_48.Position.Tree;
  snapshot.State = local_48.State;
  snapshot.Position.Position = local_48.Position.Position;
  local_70.Name._M_dataplus._M_p = (pointer)paVar2;
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,snapshot,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.Name._M_dataplus._M_p != paVar2) {
    operator_delete(local_70.Name._M_dataplus._M_p,
                    CONCAT71(local_70.Name.field_2._M_allocated_capacity._1_7_,
                             local_70.Name.field_2._M_local_buf[0]) + 1);
  }
  this->Makefile = (cmMakefile *)0x0;
  this->HaveInstallRule = false;
  this->BuildInterfaceIncludesAppended = false;
  this->DLLPlatform = false;
  this->IsAndroid = false;
  this->IsImportedTarget = false;
  this->ImportedGloballyVisible = false;
  return;
}

Assistant:

cmTarget::cmTarget()
{
  this->Makefile = 0;
#if defined(_WIN32) && !defined(__CYGWIN__)
  this->LinkLibrariesForVS6Analyzed = false;
#endif
  this->HaveInstallRule = false;
  this->DLLPlatform = false;
  this->IsAndroid = false;
  this->IsImportedTarget = false;
  this->ImportedGloballyVisible = false;
  this->BuildInterfaceIncludesAppended = false;
}